

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yebash.cpp
# Opt level: O3

void printSuggestion(HistorySuggestion *history,Printer *printer,LineBuffer *buffer,int offset)

{
  char *pcVar1;
  Color *pCVar2;
  Color color;
  undefined1 local_68 [8];
  string pattern;
  StringOpt suggestion;
  
  pcVar1 = yb::LineBuffer::get(buffer);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_68,pcVar1,(allocator<char> *)(pattern.field_2._M_local_buf + 8));
  if (offset == 0) {
    yb::HistorySuggestion::findNextSuggestion
              ((StringOpt *)((long)&pattern.field_2 + 8),history,(string *)local_68);
  }
  else {
    yb::HistorySuggestion::findSuggestion
              ((StringOpt *)((long)&pattern.field_2 + 8),history,(string *)local_68);
  }
  if (suggestion.
      super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
      .field_0._24_1_ == '\0') {
    yb::Printer::clearTerminalLine(printer);
  }
  else if ((_Alloc_hider)pattern._M_dataplus._M_p !=
           suggestion.
           super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
           .field_0._M_payload._M_dataplus._M_p) {
    pcVar1 = pattern._M_dataplus._M_p + pattern.field_2._8_8_;
    pCVar2 = (Color *)__tls_get_addr(&PTR_0010df18);
    color = grey;
    if ((char)pCVar2[1] != reset) {
      color = *pCVar2;
    }
    yb::Printer::print(printer,pcVar1,color,offset);
  }
  if ((suggestion.
       super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
       .field_0._24_1_ == '\x01') &&
     ((undefined1 *)pattern.field_2._8_8_ !=
      (undefined1 *)
      ((long)&suggestion.
              super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
              .field_0 + 8))) {
    operator_delete((void *)pattern.field_2._8_8_,
                    suggestion.
                    super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                    .field_0._M_payload._M_string_length + 1);
  }
  if (local_68 != (undefined1  [8])&pattern._M_string_length) {
    operator_delete((void *)local_68,pattern._M_string_length + 1);
  }
  return;
}

Assistant:

void printSuggestion(HistorySuggestion &history, Printer &printer, LineBuffer &buffer, int offset) {
    std::string pattern{buffer.get()};
    auto suggestion = offset ? history.findSuggestion(pattern) : history.findNextSuggestion(pattern);
    if (!suggestion) {
        printer.clearTerminalLine();
        return;
    }
    if (pattern.length() == suggestion.value().length()) {
        return;
    }
    printer.print(suggestion.value().c_str() + pattern.length(), suggestionColor.value_or(defaultSuggestionColor), offset);
}